

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::outelements(tetgenmesh *this,tetgenio *out)

{
  int iVar1;
  uint uVar2;
  tetrahedron ppdVar3;
  tetrahedron ppdVar4;
  tetrahedron ppdVar5;
  int iVar6;
  undefined8 uVar7;
  bool bVar8;
  size_t sVar9;
  long lVar10;
  FILE *__stream;
  tetrahedron *pppdVar11;
  tetgenbehavior *ptVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  int local_45c;
  int local_458;
  double *local_450;
  int *local_440;
  char outelefilename [1024];
  
  ptVar12 = this->b;
  if (out == (tetgenio *)0x0) {
    strcpy(outelefilename,ptVar12->outfilename);
    sVar9 = strlen(outelefilename);
    builtin_strncpy(outelefilename + sVar9,".ele",5);
    if (ptVar12->quiet == 0) {
      printf("Writing %s.\n",outelefilename);
    }
  }
  else if (ptVar12->quiet == 0) {
    puts("Writing elements.");
  }
  lVar17 = this->tetrahedrons->items - this->hullsize;
  uVar13 = this->numelemattrib;
  uVar18 = (ulong)uVar13;
  if (out == (tetgenio *)0x0) {
    __stream = fopen(outelefilename,"w");
    if (__stream == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",outelefilename);
      terminatetetgen(this,1);
    }
    uVar7 = 10;
    if (this->b->order == 1) {
      uVar7 = 4;
    }
    local_450 = (double *)0x0;
    fprintf(__stream,"%ld  %d  %d\n",lVar17,uVar7,uVar18);
    ptVar12 = this->b;
    local_440 = (int *)0x0;
  }
  else {
    ptVar12 = this->b;
    iVar1 = ptVar12->order;
    lVar10 = 10;
    if (iVar1 == 1) {
      lVar10 = 4;
    }
    local_440 = (int *)operator_new__(-(ulong)((ulong)(lVar10 * lVar17) >> 0x3e != 0) |
                                      lVar10 * lVar17 * 4);
    out->tetrahedronlist = local_440;
    if ((int)uVar13 < 1) {
      local_450 = out->tetrahedronattributelist;
    }
    else {
      local_450 = (double *)
                  operator_new__(-(ulong)(lVar17 * uVar18 >> 0x3d != 0) | lVar17 * uVar18 * 8);
      out->tetrahedronattributelist = local_450;
    }
    iVar6 = 10;
    if (iVar1 == 1) {
      iVar6 = 4;
    }
    out->numberoftetrahedra = (int)lVar17;
    out->numberofcorners = iVar6;
    out->numberoftetrahedronattributes = uVar13;
    __stream = (FILE *)0x0;
  }
  uVar2 = this->in->firstnumber;
  uVar15 = 0;
  if (ptVar12->zeroindex == 0) {
    uVar15 = uVar2;
  }
  bVar8 = uVar15 == 0;
  memorypool::traversalinit(this->tetrahedrons);
  pppdVar11 = tetrahedrontraverse(this);
  if ((int)uVar13 < 1) {
    uVar18 = 0;
  }
  local_45c = 0;
  local_458 = 0;
  while (pppdVar11 != (tetrahedron *)0x0) {
    ptVar12 = this->b;
    bVar19 = ptVar12->reversetetori == 0;
    lVar17 = (long)this->pointmarkindex;
    uVar16 = (uint)(uVar2 == 1 && bVar8);
    uVar13 = *(int *)((long)pppdVar11[(ulong)!bVar19 + 4] + lVar17 * 4) - uVar16;
    ppdVar3 = pppdVar11[(ulong)bVar19 + 4];
    ppdVar4 = pppdVar11[6];
    ppdVar5 = pppdVar11[7];
    if (out == (tetgenio *)0x0) {
      fprintf(__stream,"%5d   %5d %5d %5d %5d",(ulong)uVar15,(ulong)uVar13,
              (ulong)(*(int *)((long)ppdVar3 + lVar17 * 4) - uVar16),
              (ulong)(*(int *)((long)ppdVar4 + lVar17 * 4) - uVar16),
              (ulong)(*(int *)((long)ppdVar5 + lVar17 * 4) - uVar16));
      if (this->b->order == 2) {
        ppdVar3 = pppdVar11[0xb];
        lVar17 = (long)this->pointmarkindex;
        fprintf(__stream,"  %5d %5d %5d %5d %5d %5d",
                (ulong)(*(int *)((long)*ppdVar3 + lVar17 * 4) - uVar16),
                (ulong)(*(int *)((long)ppdVar3[1] + lVar17 * 4) - uVar16),
                (ulong)(*(int *)((long)ppdVar3[2] + lVar17 * 4) - uVar16),
                (ulong)(*(int *)((long)ppdVar3[3] + lVar17 * 4) - uVar16),
                (ulong)(*(int *)((long)ppdVar3[4] + lVar17 * 4) - uVar16),
                (ulong)(*(int *)((long)ppdVar3[5] + lVar17 * 4) - uVar16));
      }
      for (lVar17 = 0; (int)uVar18 != (int)lVar17; lVar17 = lVar17 + 1) {
        fprintf(__stream,"    %.17g",pppdVar11[this->elemattribindex + lVar17]);
      }
      fputc(10,__stream);
      ptVar12 = this->b;
    }
    else {
      local_440[local_45c] = uVar13;
      local_440[(long)local_45c + 1] = *(int *)((long)ppdVar3 + lVar17 * 4) - uVar16;
      local_440[(long)local_45c + 2] = *(int *)((long)ppdVar4 + lVar17 * 4) - uVar16;
      local_440[(long)local_45c + 3] = *(int *)((long)ppdVar5 + lVar17 * 4) - uVar16;
      iVar1 = local_45c + 4;
      if (ptVar12->order == 2) {
        ppdVar3 = pppdVar11[0xb];
        local_440[local_45c + 4] = *(int *)((long)*ppdVar3 + lVar17 * 4) - uVar16;
        local_440[(long)local_45c + 5] = *(int *)((long)ppdVar3[1] + lVar17 * 4) - uVar16;
        local_440[(long)local_45c + 6] = *(int *)((long)ppdVar3[2] + lVar17 * 4) - uVar16;
        local_440[(long)local_45c + 7] = *(int *)((long)ppdVar3[3] + lVar17 * 4) - uVar16;
        local_440[(long)local_45c + 8] = *(int *)((long)ppdVar3[4] + lVar17 * 4) - uVar16;
        local_440[(long)local_45c + 9] = *(int *)((long)ppdVar3[5] + lVar17 * 4) - uVar16;
        iVar1 = local_45c + 10;
      }
      local_45c = iVar1;
      iVar1 = this->elemattribindex;
      for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
        local_450[(long)local_458 + uVar14] = (double)pppdVar11[(long)iVar1 + uVar14];
      }
      local_458 = local_458 + (int)uVar14;
    }
    *(uint *)(pppdVar11 + 10) = uVar15;
    if (ptVar12->metric != 0) {
      iVar1 = this->point2simindex;
      for (lVar17 = 4; lVar17 != 8; lVar17 = lVar17 + 1) {
        pppdVar11[lVar17][iVar1] = (double *)pppdVar11;
      }
    }
    pppdVar11 = tetrahedrontraverse(this);
    uVar15 = uVar15 + 1;
  }
  if (out == (tetgenio *)0x0) {
    fprintf(__stream,"# Generated by %s\n",this->b->commandline);
    fclose(__stream);
  }
  return;
}

Assistant:

void tetgenmesh::outelements(tetgenio* out)
{
  FILE *outfile = NULL;
  char outelefilename[FILENAMESIZE];
  tetrahedron* tptr;
  point p1, p2, p3, p4;
  point *extralist;
  REAL *talist = NULL;
  int *tlist = NULL;
  long ntets;
  int firstindex, shift;
  int pointindex, attribindex;
  int highorderindex = 11; 
  int elementnumber;
  int eextras;
  int i;

  if (out == (tetgenio *) NULL) {
    strcpy(outelefilename, b->outfilename);
    strcat(outelefilename, ".ele");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", outelefilename);
    } else {
      printf("Writing elements.\n");
    }
  }

  // The number of tets excluding hull tets.
  ntets = tetrahedrons->items - hullsize;

  eextras = numelemattrib;
  if (out == (tetgenio *) NULL) {
    outfile = fopen(outelefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", outelefilename);
      terminatetetgen(this, 1);
    }
    // Number of tetras, points per tetra, attributes per tetra.
    fprintf(outfile, "%ld  %d  %d\n", ntets, b->order == 1 ? 4 : 10, eextras);
  } else {
    // Allocate memory for output tetrahedra.
    out->tetrahedronlist = new int[ntets * (b->order == 1 ? 4 : 10)];
    if (out->tetrahedronlist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    // Allocate memory for output tetrahedron attributes if necessary.
    if (eextras > 0) {
      out->tetrahedronattributelist = new REAL[ntets * eextras];
      if (out->tetrahedronattributelist == (REAL *) NULL) {
        printf("Error:  Out of memory.\n");
        terminatetetgen(this, 1);
      }
    }
    out->numberoftetrahedra = ntets;
    out->numberofcorners = b->order == 1 ? 4 : 10;
    out->numberoftetrahedronattributes = eextras;
    tlist = out->tetrahedronlist;
    talist = out->tetrahedronattributelist;
    pointindex = 0;
    attribindex = 0;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shift.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  tetrahedrons->traversalinit();
  tptr = tetrahedrontraverse();
  elementnumber = firstindex; // in->firstnumber;
  while (tptr != (tetrahedron *) NULL) {
    if (!b->reversetetori) {
      p1 = (point) tptr[4];
      p2 = (point) tptr[5];
    } else {
      p1 = (point) tptr[5];
      p2 = (point) tptr[4];
    }
    p3 = (point) tptr[6];
    p4 = (point) tptr[7];
    if (out == (tetgenio *) NULL) {
      // Tetrahedron number, indices for four points.
      fprintf(outfile, "%5d   %5d %5d %5d %5d", elementnumber,
              pointmark(p1) - shift, pointmark(p2) - shift,
              pointmark(p3) - shift, pointmark(p4) - shift);
      if (b->order == 2) {
        extralist = (point *) tptr[highorderindex];
        // indices for six extra points.
        fprintf(outfile, "  %5d %5d %5d %5d %5d %5d",
          pointmark(extralist[0]) - shift, pointmark(extralist[1]) - shift,
          pointmark(extralist[2]) - shift, pointmark(extralist[3]) - shift,
          pointmark(extralist[4]) - shift, pointmark(extralist[5]) - shift);
      }
      for (i = 0; i < eextras; i++) {
        fprintf(outfile, "    %.17g", elemattribute(tptr, i));
      }
      fprintf(outfile, "\n");
    } else {
      tlist[pointindex++] = pointmark(p1) - shift;
      tlist[pointindex++] = pointmark(p2) - shift;
      tlist[pointindex++] = pointmark(p3) - shift;
      tlist[pointindex++] = pointmark(p4) - shift;
      if (b->order == 2) {
        extralist = (point *) tptr[highorderindex];
        tlist[pointindex++] = pointmark(extralist[0]) - shift;
        tlist[pointindex++] = pointmark(extralist[1]) - shift;
        tlist[pointindex++] = pointmark(extralist[2]) - shift;
        tlist[pointindex++] = pointmark(extralist[3]) - shift;
        tlist[pointindex++] = pointmark(extralist[4]) - shift;
        tlist[pointindex++] = pointmark(extralist[5]) - shift;
      }
      for (i = 0; i < eextras; i++) {
        talist[attribindex++] = elemattribute(tptr, i);
      }
    }
    // Remember the index of this element (for counting edges).
    setelemindex(tptr, elementnumber);
	if (b->metric) { // -m option
	  // Update the point-to-tet map, so that every point is pointing
	  //   to a real tet, not a fictious one. Used by .p2t file.
	  for (int i = 0; i < 4; i++) {
	    setpoint2tet((point) (tptr[4 + i]), (tetrahedron) tptr);
	  }
	}
    tptr = tetrahedrontraverse();
    elementnumber++;
  }


  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}